

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall
notch::core::FullyConnectedLayer::setLearningPolicy(FullyConnectedLayer *this,ALearningPolicy *lp)

{
  ALearningPolicy *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_notch::core::ALearningPolicy_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  (*lp->_vptr_ALearningPolicy[1])(&local_18);
  ::std::__shared_ptr<notch::core::ALearningPolicy,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<notch::core::ALearningPolicy,(__gnu_cxx::_Lock_policy)2> *)&this->policy,
             (unique_ptr<notch::core::ALearningPolicy,_std::default_delete<notch::core::ALearningPolicy>_>
              *)&local_18);
  if (local_18._M_head_impl != (ALearningPolicy *)0x0) {
    operator_delete(local_18._M_head_impl);
  }
  return;
}

Assistant:

virtual void setLearningPolicy(const ALearningPolicy &lp) {
        policy = lp.clone();
    }